

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

bool __thiscall cmGlobalGenerator::Compute(cmGlobalGenerator *this)

{
  cmLocalGenerator *pcVar1;
  cmMakefile *pcVar2;
  pointer ppcVar3;
  bool bVar4;
  int iVar5;
  pointer ppcVar6;
  pointer ppcVar7;
  pointer ppcVar8;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->FilesReplacedDuringGenerate,
                    (this->FilesReplacedDuringGenerate).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->CMP0042WarnTargets)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->CMP0068WarnTargets)._M_t);
  iVar5 = (*this->_vptr_cmGlobalGenerator[0x30])(this);
  if ((char)iVar5 != '\0') {
    FinalizeTargetCompileInfo(this);
    CreateLocalGenerators(this);
    CreateGeneratorTargets(this,AllTargets);
    ComputeBuildFileGenerators(this);
    FillProjectMap(this);
    bVar4 = QtAutoGen(this);
    if (!bVar4) {
      return false;
    }
    ppcVar8 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppcVar6 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppcVar8 != ppcVar6) {
      do {
        (*(*ppcVar8)->_vptr_cmLocalGenerator[4])();
        ppcVar8 = ppcVar8 + 1;
      } while (ppcVar8 != ppcVar6);
      ppcVar8 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppcVar6 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppcVar8 != ppcVar6) {
        do {
          bVar4 = cmLocalGenerator::ComputeTargetCompileFeatures(*ppcVar8);
          if (!bVar4) {
            return false;
          }
          ppcVar8 = ppcVar8 + 1;
        } while (ppcVar8 != ppcVar6);
        ppcVar8 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppcVar6 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      for (; ppcVar8 != ppcVar6; ppcVar8 = ppcVar8 + 1) {
        pcVar1 = *ppcVar8;
        pcVar2 = pcVar1->Makefile;
        ppcVar3 = (pcVar2->InstallGenerators).
                  super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppcVar7 = (pcVar2->InstallGenerators).
                       super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppcVar7 != ppcVar3;
            ppcVar7 = ppcVar7 + 1) {
          iVar5 = (*((*ppcVar7)->super_cmScriptGenerator)._vptr_cmScriptGenerator[10])
                            (*ppcVar7,pcVar1);
          if ((char)iVar5 == '\0') {
            return false;
          }
        }
      }
    }
    (*this->_vptr_cmGlobalGenerator[0xc])(this);
    ppcVar6 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar8 = (this->LocalGenerators).
                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar8 != ppcVar6;
        ppcVar8 = ppcVar8 + 1) {
      cmLocalGenerator::TraceDependencies(*ppcVar8);
    }
    bVar4 = CheckTargetsForMissingSources(this);
    if (!bVar4) {
      (*this->_vptr_cmGlobalGenerator[0x32])(this);
      ppcVar6 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppcVar8 = (this->LocalGenerators).
                     super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppcVar8 != ppcVar6;
          ppcVar8 = ppcVar8 + 1) {
        cmLocalGenerator::ComputeTargetManifest(*ppcVar8);
      }
      iVar5 = (*this->_vptr_cmGlobalGenerator[0x2f])(this);
      if (((char)iVar5 != '\0') && (bVar4 = CheckTargetsForType(this), !bVar4)) {
        ppcVar6 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppcVar8 = (this->LocalGenerators).
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                       _M_impl.super__Vector_impl_data._M_start; ppcVar8 != ppcVar6;
            ppcVar8 = ppcVar8 + 1) {
          (*(*ppcVar8)->_vptr_cmLocalGenerator[3])();
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool cmGlobalGenerator::Compute()
{
  // Some generators track files replaced during the Generate.
  // Start with an empty vector:
  this->FilesReplacedDuringGenerate.clear();

  // clear targets to issue warning CMP0042 for
  this->CMP0042WarnTargets.clear();
  // clear targets to issue warning CMP0068 for
  this->CMP0068WarnTargets.clear();

  // Check whether this generator is allowed to run.
  if (!this->CheckALLOW_DUPLICATE_CUSTOM_TARGETS()) {
    return false;
  }
  this->FinalizeTargetCompileInfo();

  this->CreateGenerationObjects();

  // at this point this->LocalGenerators has been filled,
  // so create the map from project name to vector of local generators
  this->FillProjectMap();

  // Iterate through all targets and set up AUTOMOC, AUTOUIC and AUTORCC
  if (!this->QtAutoGen()) {
    return false;
  }

  // Add generator specific helper commands
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    localGen->AddHelperCommands();
  }

  // Finalize the set of compile features for each target.
  // FIXME: This turns into calls to cmMakefile::AddRequiredTargetFeature
  // which actually modifies the <lang>_STANDARD target property
  // on the original cmTarget instance.  It accumulates features
  // across all configurations.  Some refactoring is needed to
  // compute a per-config resulta purely during generation.
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    if (!localGen->ComputeTargetCompileFeatures()) {
      return false;
    }
  }

  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    cmMakefile* mf = localGen->GetMakefile();
    for (cmInstallGenerator* g : mf->GetInstallGenerators()) {
      if (!g->Compute(localGen)) {
        return false;
      }
    }
  }

  this->AddExtraIDETargets();

  // Trace the dependencies, after that no custom commands should be added
  // because their dependencies might not be handled correctly
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    localGen->TraceDependencies();
  }

  // Make sure that all (non-imported) targets have source files added!
  if (this->CheckTargetsForMissingSources()) {
    return false;
  }

  this->ForceLinkerLanguages();

  // Compute the manifest of main targets generated.
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    localGen->ComputeTargetManifest();
  }

  // Compute the inter-target dependencies.
  if (!this->ComputeTargetDepends()) {
    return false;
  }

  if (this->CheckTargetsForType()) {
    return false;
  }

  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    localGen->ComputeHomeRelativeOutputPath();
  }

  return true;
}